

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void __thiscall duckdb::Linenoise::EditHistoryNext(Linenoise *this,HistoryScrollDirection dir)

{
  bool bVar1;
  idx_t iVar2;
  char *__src;
  size_t sVar3;
  size_t sVar4;
  undefined1 in_SIL;
  Linenoise *in_RDI;
  idx_t history_len;
  char *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd0;
  Linenoise *this_00;
  int in_stack_fffffffffffffff0;
  undefined3 in_stack_fffffffffffffff4;
  int target_row;
  Linenoise *this_01;
  
  target_row = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  this_01 = in_RDI;
  iVar2 = History::GetLength();
  if (1 < iVar2) {
    History::Overwrite(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    switch((char)((uint)target_row >> 0x18)) {
    case '\0':
      if (in_RDI->history_index == 0) {
        return;
      }
      in_RDI->history_index = in_RDI->history_index - 1;
      break;
    case '\x01':
      in_RDI->history_index = in_RDI->history_index + 1;
      if (iVar2 <= in_RDI->history_index) {
        in_RDI->history_index = iVar2 - 1;
        return;
      }
      break;
    case '\x02':
      in_RDI->history_index = iVar2 - 1;
      break;
    case '\x03':
      in_RDI->history_index = 0;
    }
    this_00 = (Linenoise *)in_RDI->buf;
    __src = History::GetEntry((iVar2 - 1) - in_RDI->history_index);
    strncpy((char *)this_00,__src,in_RDI->buflen);
    in_RDI->buf[in_RDI->buflen - 1] = '\0';
    sVar3 = strlen(in_RDI->buf);
    in_RDI->pos = sVar3;
    in_RDI->len = sVar3;
    bVar1 = Terminal::IsMultiline();
    if ((bVar1) && ((char)((uint)target_row >> 0x18) == '\0')) {
      sVar4 = ColAndRowToPosition(this_01,target_row,in_stack_fffffffffffffff0);
      in_RDI->pos = sVar4;
    }
    RefreshLine(this_00);
  }
  return;
}

Assistant:

void Linenoise::EditHistoryNext(HistoryScrollDirection dir) {
	auto history_len = History::GetLength();
	if (history_len > 1) {
		/* Update the current history entry before to
		 * overwrite it with the next one. */
		History::Overwrite(history_len - 1 - history_index, buf);
		/* Show the new entry */
		switch (dir) {
		case HistoryScrollDirection::LINENOISE_HISTORY_PREV:
			// scroll back
			history_index++;
			if (history_index >= history_len) {
				history_index = history_len - 1;
				return;
			}
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_NEXT:
			// scroll forwards
			if (history_index == 0) {
				return;
			}
			history_index--;
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_END:
			history_index = 0;
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_START:
			history_index = history_len - 1;
			break;
		}
		strncpy(buf, History::GetEntry(history_len - 1 - history_index), buflen);
		buf[buflen - 1] = '\0';
		len = pos = strlen(buf);
		if (Terminal::IsMultiline() && dir == HistoryScrollDirection::LINENOISE_HISTORY_NEXT) {
			pos = ColAndRowToPosition(1, len);
		}
		RefreshLine();
	}
}